

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O2

void __thiscall
soplex::SPxLPBase<double>::addRows
          (SPxLPBase<double> *this,SPxRowId *id,LPRowSetBase<double> *set,bool scale)

{
  DataKey DVar1;
  undefined3 in_register_00000009;
  int n;
  
  n = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[8])
            (this,set,(ulong)CONCAT31(in_register_00000009,scale));
  for (; n < (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum; n = n + 1) {
    DVar1 = (DataKey)rId(this,n);
    *id = (SPxRowId)DVar1;
    id = (SPxRowId *)(&id->super_DataKey + 1);
  }
  return;
}

Assistant:

virtual void addRows(SPxRowId id[], const LPRowSetBase<R>& set, bool scale = false)
   {
      int i = nRows();
      addRows(set, scale);

      for(int j = 0; i < nRows(); ++i, ++j)
         id[j] = rId(i);
   }